

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O0

Field __thiscall
winmd::reader::EnumDefinition::get_enumerator(EnumDefinition *this,string_view *name)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  Field *pFVar5;
  Field FVar6;
  Field FVar7;
  Field __last;
  undefined1 local_48 [8];
  pair<winmd::reader::Field,_winmd::reader::Field> fields;
  string_view *name_local;
  EnumDefinition *this_local;
  Field field;
  
  fields.second.super_row_base<winmd::reader::Field>._8_8_ = name;
  TypeDef::FieldList((pair<winmd::reader::Field,_winmd::reader::Field> *)local_48,&this->m_typedef);
  pFVar5 = begin<winmd::reader::Field>((pair<winmd::reader::Field,_winmd::reader::Field> *)local_48)
  ;
  uVar1 = (pFVar5->super_row_base<winmd::reader::Field>).m_table;
  uVar2 = (pFVar5->super_row_base<winmd::reader::Field>).m_index;
  FVar6.super_row_base<winmd::reader::Field>.m_index = uVar2;
  FVar6.super_row_base<winmd::reader::Field>.m_table = (table_base *)uVar1;
  pFVar5 = end<winmd::reader::Field>((pair<winmd::reader::Field,_winmd::reader::Field> *)local_48);
  uVar3 = (pFVar5->super_row_base<winmd::reader::Field>).m_table;
  uVar4 = (pFVar5->super_row_base<winmd::reader::Field>).m_index;
  __last.super_row_base<winmd::reader::Field>.m_index = uVar4;
  __last.super_row_base<winmd::reader::Field>.m_table = (table_base *)uVar3;
  FVar6.super_row_base<winmd::reader::Field>._12_4_ = 0;
  __last.super_row_base<winmd::reader::Field>._12_4_ = 0;
  FVar6 = std::
          find_if<winmd::reader::Field,winmd::reader::EnumDefinition::get_enumerator(std::basic_string_view<char,std::char_traits<char>>const&)const::_lambda(auto:1&&)_1_>
                    (FVar6,__last,
                     (anon_class_8_1_898f2789_for__M_pred)
                     fields.second.super_row_base<winmd::reader::Field>._8_8_);
  FVar7.super_row_base<winmd::reader::Field>._12_4_ = 0;
  FVar7.super_row_base<winmd::reader::Field>.m_table =
       (table_base *)SUB128(FVar6.super_row_base<winmd::reader::Field>._0_12_,0);
  FVar7.super_row_base<winmd::reader::Field>.m_index =
       SUB124(FVar6.super_row_base<winmd::reader::Field>._0_12_,8);
  return (Field)FVar7.super_row_base<winmd::reader::Field>;
}

Assistant:

auto get_enumerator(std::string_view const& name) const
        {
            auto fields = m_typedef.FieldList();

            auto field = std::find_if(begin(fields), end(fields), [&](auto&& field)
            {
                return field.Name() == name;
            });

            XLANG_ASSERT(field != end(fields));
            return field;
        }